

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

void __thiscall Assimp::Ogre::IndexData::~IndexData(IndexData *this)

{
  std::__shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->buffer).super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->buffer).super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

IndexData::~IndexData()
{
    Reset();
}